

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,JsonCodec *this,
          ArrayPtr<const_char> input,Type type,Orphanage orphanage)

{
  Builder output;
  Reader input_00;
  Builder json;
  MallocMessageBuilder message;
  StructBuilder local_1a8;
  Builder local_180;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  PointerBuilder local_138;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_180,&local_120.super_MessageBuilder);
  local_138.pointer = local_180.builder.pointer;
  local_138.segment = local_180.builder.segment;
  local_138.capTable = local_180.builder.capTable;
  capnp::_::PointerBuilder::getStruct(&local_1a8,&local_138,(StructSize)0x10002,(word *)0x0);
  output._builder.capTable = local_1a8.capTable;
  output._builder.segment = local_1a8.segment;
  output._builder.data = local_1a8.data;
  output._builder.pointers = local_1a8.pointers;
  output._builder.dataSize = local_1a8.dataSize;
  output._builder.pointerCount = local_1a8.pointerCount;
  output._builder._38_2_ = local_1a8._38_2_;
  decodeRaw(this,input,output);
  capnp::_::StructBuilder::asReader(&local_1a8);
  input_00._reader.capTable = (CapTableReader *)uStack_160;
  input_00._reader.segment = (SegmentReader *)local_168;
  input_00._reader.data = (void *)local_158;
  input_00._reader.pointers = (WirePointer *)uStack_150;
  input_00._reader.dataSize = (undefined4)local_148;
  input_00._reader.pointerCount = local_148._4_2_;
  input_00._reader._38_2_ = local_148._6_2_;
  input_00._reader._40_8_ = uStack_140;
  decode(__return_storage_ptr__,this,input_00,type,orphanage);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> JsonCodec::decode(
    kj::ArrayPtr<const char> input, Type type, Orphanage orphanage) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  decodeRaw(input, json);
  return decode(json, type, orphanage);
}